

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O1

string * __thiscall
ELFIO::section_impl<ELFIO::Elf64_Shdr>::get_name_abi_cxx11_
          (string *__return_storage_ptr__,section_impl<ELFIO::Elf64_Shdr> *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->name)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string
    get_name() const
    {
        return name;
    }